

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O1

BOOL __thiscall
Js::ModuleRoot::DeleteProperty(ModuleRoot *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  HostObjectBase *pHVar1;
  PropertyIndex PVar2;
  int iVar3;
  BOOL BVar4;
  
  PVar2 = DynamicObject::GetPropertyIndex((DynamicObject *)this,propertyId);
  if (PVar2 != 0xffff) {
    return 0;
  }
  pHVar1 = (this->super_RootObjectBase).hostObject.ptr;
  if (pHVar1 != (HostObjectBase *)0x0) {
    iVar3 = (**(code **)(*(long *)pHVar1 + 0x58))(pHVar1,propertyId,0);
    if (iVar3 == 1) {
      pHVar1 = (this->super_RootObjectBase).hostObject.ptr;
      BVar4 = (**(code **)(*(long *)pHVar1 + 0x108))(pHVar1,propertyId,flags);
      return BVar4;
    }
  }
  BVar4 = GlobalObject::DeleteProperty
                    ((((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                         type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     globalObject.ptr,propertyId,flags);
  return BVar4;
}

Assistant:

BOOL ModuleRoot::DeleteProperty(PropertyId propertyId, PropertyOperationFlags flags)
    {
        int index = GetPropertyIndex(propertyId);
        if (index != Constants::NoSlot)
        {
            return FALSE;
        }
        else if (this->hostObject && this->hostObject->HasProperty(propertyId))
        {
            return this->hostObject->DeleteProperty(propertyId, flags);
        }
        return this->GetLibrary()->GetGlobalObject()->GlobalObject::DeleteProperty(propertyId, flags);
    }